

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int * nifti_get_intlist(int nvals,char *str)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int *__ptr;
  ulong uVar4;
  ushort *puVar5;
  uint uVar6;
  ulong uVar7;
  char *__format;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  char *pcVar13;
  size_t __size;
  int local_8c;
  char *cpt;
  ushort **local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  long local_48;
  char *local_40;
  size_t local_38;
  
  if ((str != (char *)0x0 && 0 < nvals) && (cVar1 = *str, cVar1 != '\0')) {
    __ptr = (int *)malloc(8);
    if (__ptr == (int *)0x0) {
      fwrite("** nifti_get_intlist: failed alloc of 2 ints\n",0x2d,1,_stderr);
    }
    else {
      *__ptr = 0;
      if (1 < g_opts_0) {
        fprintf(_stderr,"-d making int_list (vals = %d) from \'%s\'\n",(ulong)(uint)nvals,str);
      }
      uVar7 = (ulong)((cVar1 + 0xa5U & 0xdf) == 0);
      local_38 = strlen(str);
      uVar2 = nvals - 1;
      local_48 = 1 - (long)str;
      local_40 = str + -1;
      local_8c = 0;
      local_60 = (ulong)(uint)nvals;
      while( true ) {
        if ((int)local_38 <= (int)uVar7) break;
        uVar7 = (ulong)(int)uVar7;
        cVar1 = str[uVar7];
        if (((cVar1 == '\0') || (cVar1 == ']')) || (cVar1 == '}')) break;
        local_68 = __ctype_b_loc();
        puVar5 = *local_68;
        lVar12 = 1 - uVar7;
        do {
          cVar1 = str[uVar7];
          uVar7 = uVar7 + 1;
          lVar12 = lVar12 + -1;
        } while ((*(byte *)((long)puVar5 + (long)cVar1 * 2 + 1) & 0x20) != 0);
        if (cVar1 != '$') {
          if (((cVar1 != '\0') && (cVar1 != ']')) && (cVar1 != '}')) {
            pcVar13 = str + -lVar12;
            uVar4 = strtol(pcVar13,&cpt,10);
            iVar3 = (int)uVar4;
            if ((iVar3 < 0) || ((int)local_60 <= iVar3)) {
              pcVar13 = "** ERROR: list index %d is out of range 0..%d\n";
LAB_001117db:
              fprintf(_stderr,pcVar13,uVar4 & 0xffffffff,(ulong)uVar2);
            }
            else {
              uVar7 = ((ulong)(uint)cpt + local_48) - uVar7;
              if ((iVar3 != 0) || ((uVar7 & 0xffffffff) != 0)) {
                uVar7 = uVar7 - lVar12;
                puVar5 = *local_68;
                goto LAB_001113d6;
              }
              __format = "** ERROR: list syntax error \'%s\'\n";
LAB_0011180a:
              fprintf(_stderr,__format,pcVar13);
            }
            goto LAB_001116dc;
          }
          break;
        }
        uVar4 = (ulong)uVar2;
LAB_001113d6:
        pcVar13 = local_40 + (int)uVar7;
        lVar12 = (uVar7 << 0x20) + -0x100000000;
        do {
          lVar12 = lVar12 + 0x100000000;
          cVar1 = pcVar13[1];
          pcVar13 = pcVar13 + 1;
          uVar6 = (int)uVar7 + 1;
          uVar7 = (ulong)uVar6;
        } while ((*(byte *)((long)puVar5 + (long)cVar1 * 2 + 1) & 0x20) != 0);
        lVar8 = (long)local_8c;
        iVar3 = (int)uVar4;
        if ((cVar1 == '\0') || (cVar1 == ',')) {
LAB_00111443:
          __ptr = (int *)realloc(__ptr,lVar8 * 4 + 8);
          if (__ptr == (int *)0x0) {
LAB_001116a5:
            fprintf(_stderr,"** nifti_get_intlist: failed realloc of %d ints\n",
                    (ulong)(local_8c + 2));
            return (int *)0x0;
          }
          local_8c = local_8c + 1;
          *__ptr = local_8c;
          __ptr[local_8c] = iVar3;
          cVar1 = *pcVar13;
          if (((cVar1 == '\0') || (cVar1 == ']')) || (cVar1 == '}')) break;
        }
        else {
          iVar9 = 1;
          if (cVar1 != '-') {
            if (cVar1 == '.') {
              iVar9 = 2;
              if (str[(lVar12 >> 0x20) + 1] == '.') goto LAB_001114bc;
            }
            else if ((cVar1 == '}') || (cVar1 == ']')) goto LAB_00111443;
            __format = "** ERROR: index list syntax is bad: \'%s\'\n";
            goto LAB_0011180a;
          }
LAB_001114bc:
          iVar10 = iVar9 + uVar6 + -1;
          local_50 = lVar8;
          if (str[iVar10] == '$') {
            iVar9 = iVar9 + uVar6;
            uVar7 = (ulong)uVar2;
          }
          else {
            pcVar13 = str + iVar10;
            uVar7 = strtol(pcVar13,&cpt,10);
            iVar11 = (int)uVar7;
            if ((iVar11 < 0) || ((int)local_60 <= iVar11)) {
              pcVar13 = "** ERROR: index %d is out of range 0..%d\n";
              uVar4 = uVar7;
              goto LAB_001117db;
            }
            iVar9 = (uint)cpt - (int)pcVar13;
            if (iVar11 == 0 && iVar9 == 0) {
              __format = "** ERROR: index list syntax error \'%s\'\n";
              goto LAB_0011180a;
            }
            iVar9 = iVar10 + iVar9;
            puVar5 = *local_68;
          }
          pcVar13 = str + iVar9;
          do {
            iVar10 = iVar9;
            cVar1 = *pcVar13;
            iVar9 = iVar10 + 1;
            pcVar13 = pcVar13 + 1;
          } while ((*(byte *)((long)puVar5 + (long)cVar1 * 2 + 1) & 0x20) != 0);
          iVar11 = iVar3 - (int)uVar7;
          if (cVar1 == '(') {
            local_58 = uVar7;
            lVar12 = strtol(str + iVar9,&cpt,10);
            iVar3 = (int)lVar12;
            if (iVar3 == 0) {
              fwrite("** ERROR: index loop step is 0!\n",0x20,1,_stderr);
              goto LAB_001116dc;
            }
            iVar9 = iVar9 + ((uint)cpt - (int)(str + iVar9));
            iVar10 = iVar9 + (uint)(str[iVar9] == ')');
            if (0 < iVar11 * iVar3) {
              fprintf(_stderr,"** WARNING: index list \'%d..%d(%d)\' means nothing\n",
                      uVar4 & 0xffffffff,local_58);
            }
          }
          else {
            iVar3 = (uint)(iVar11 == 0 || iVar3 < (int)uVar7) * 2 + -1;
          }
          __size = local_50 * 4 + 8;
          for (iVar11 = iVar11 * iVar3; iVar11 < 1; iVar11 = iVar11 + iVar3 * iVar3) {
            __ptr = (int *)realloc(__ptr,__size);
            if (__ptr == (int *)0x0) goto LAB_001116a5;
            local_8c = local_8c + 1;
            *__ptr = local_8c;
            *(int *)((long)__ptr + (__size - 4)) = (int)uVar4;
            uVar4 = (ulong)(uint)((int)uVar4 + iVar3);
            __size = __size + 4;
          }
          iVar3 = iVar10 + -1;
          pcVar13 = str + iVar10;
          do {
            cVar1 = *pcVar13;
            iVar3 = iVar3 + 1;
            pcVar13 = pcVar13 + 1;
          } while ((*(byte *)((long)*local_68 + (long)cVar1 * 2 + 1) & 0x20) != 0);
          uVar7 = (ulong)((uint)(cVar1 == ',') + iVar3);
        }
      }
      lVar12 = 1;
      iVar3 = *__ptr;
      if (1 < g_opts_0) {
        fprintf(_stderr,"+d int_list (vals = %d): ");
        for (; lVar12 <= *__ptr; lVar12 = lVar12 + 1) {
          fprintf(_stderr,"%d ",(ulong)(uint)__ptr[lVar12]);
        }
        fputc(10,_stderr);
        iVar3 = *__ptr;
      }
      if (iVar3 != 0) {
        return __ptr;
      }
LAB_001116dc:
      free(__ptr);
    }
  }
  return (int *)0x0;
}

Assistant:

int * nifti_get_intlist( int nvals , const char * str )
{
   int *subv = NULL ;
   int ii , ipos , nout , slen ;
   int ibot,itop,istep , nused ;
   char *cpt ;

   /* Meaningless input? */
   if( nvals < 1 ) return NULL ;

   /* No selection list? */
   if( str == NULL || str[0] == '\0' ) return NULL ;

   /* skip initial '[' or '{' */
   subv = (int *)malloc( sizeof(int) * 2 ) ;
   if( !subv ) {
      fprintf(stderr,"** nifti_get_intlist: failed alloc of 2 ints\n");
      return NULL;
   }
   subv[0] = nout = 0 ;

   ipos = 0 ;
   if( str[ipos] == '[' || str[ipos] == '{' ) ipos++ ;

   if( g_opts.debug > 1 )
      fprintf(stderr,"-d making int_list (vals = %d) from '%s'\n", nvals, str);

   /**- for each sub-selector until end of input... */

   slen = (int)strlen(str) ;
   while( ipos < slen && !ISEND(str[ipos]) ){

     while( isspace((int) str[ipos]) ) ipos++ ;   /* skip blanks */
      if( ISEND(str[ipos]) ) break ;         /* done */

      /**- get starting value */

      if( str[ipos] == '$' ){  /* special case */
         ibot = nvals-1 ; ipos++ ;
      } else {                 /* decode an integer */
         ibot = strtol( str+ipos , &cpt , 10 ) ;
         if( ibot < 0 ){
           fprintf(stderr,"** ERROR: list index %d is out of range 0..%d\n",
                   ibot,nvals-1) ;
           free(subv) ; return NULL ;
         }
         if( ibot >= nvals ){
           fprintf(stderr,"** ERROR: list index %d is out of range 0..%d\n",
                   ibot,nvals-1) ;
           free(subv) ; return NULL ;
         }
         nused = (cpt-(str+ipos)) ;
         if( ibot == 0 && nused == 0 ){
           fprintf(stderr,"** ERROR: list syntax error '%s'\n",str+ipos) ;
           free(subv) ; return NULL ;
         }
         ipos += nused ;
      }

      while( isspace((int) str[ipos]) ) ipos++ ;   /* skip blanks */

      /**- if that's it for this sub-selector, add one value to list */

      if( str[ipos] == ',' || ISEND(str[ipos]) ){
         nout++ ;
         subv = (int *)realloc( (char *)subv , sizeof(int) * (nout+1) ) ;
         if( !subv ) {
            fprintf(stderr,"** nifti_get_intlist: failed realloc of %d ints\n",
                    nout+1);
            return NULL;
         }
         subv[0]    = nout ;
         subv[nout] = ibot ;
         if( ISEND(str[ipos]) ) break ; /* done */
         ipos++ ; continue ;            /* re-start loop at next sub-selector */
      }

      /**- otherwise, must have '..' or '-' as next inputs */

      if( str[ipos] == '-' ){
         ipos++ ;
      } else if( str[ipos] == '.' && str[ipos+1] == '.' ){
         ipos++ ; ipos++ ;
      } else {
         fprintf(stderr,"** ERROR: index list syntax is bad: '%s'\n",
                 str+ipos) ;
         free(subv) ; return NULL ;
      }

      /**- get ending value for loop now */

      if( str[ipos] == '$' ){  /* special case */
         itop = nvals-1 ; ipos++ ;
      } else {                 /* decode an integer */
         itop = strtol( str+ipos , &cpt , 10 ) ;
         if( itop < 0 ){
           fprintf(stderr,"** ERROR: index %d is out of range 0..%d\n",
                   itop,nvals-1) ;
           free(subv) ; return NULL ;
         }
         if( itop >= nvals ){
           fprintf(stderr,"** ERROR: index %d is out of range 0..%d\n",
                   itop,nvals-1) ;
           free(subv) ; return NULL ;
         }
         nused = (cpt-(str+ipos)) ;
         if( itop == 0 && nused == 0 ){
           fprintf(stderr,"** ERROR: index list syntax error '%s'\n",str+ipos) ;
           free(subv) ; return NULL ;
         }
         ipos += nused ;
      }

      /**- set default loop step */

      istep = (ibot <= itop) ? 1 : -1 ;

      while( isspace((int) str[ipos]) ) ipos++ ;            /* skip blanks */

      /**- check if we have a non-default loop step */

      if( str[ipos] == '(' ){  /* decode an integer */
         ipos++ ;
         istep = strtol( str+ipos , &cpt , 10 ) ;
         if( istep == 0 ){
           fprintf(stderr,"** ERROR: index loop step is 0!\n") ;
           free(subv) ; return NULL ;
         }
         nused = (cpt-(str+ipos)) ;
         ipos += nused ;
         if( str[ipos] == ')' ) ipos++ ;
         if( (ibot-itop)*istep > 0 ){
           fprintf(stderr,"** WARNING: index list '%d..%d(%d)' means nothing\n",
                   ibot,itop,istep ) ;
         }
      }

      /**- add values to output */

      for( ii=ibot ; (ii-itop)*istep <= 0 ; ii += istep ){
         nout++ ;
         subv = (int *)realloc( (char *)subv , sizeof(int) * (nout+1) ) ;
         if( !subv ) {
            fprintf(stderr,"** nifti_get_intlist: failed realloc of %d ints\n",
                    nout+1);
            return NULL;
         }
         subv[0]    = nout ;
         subv[nout] = ii ;
      }

      /**- check if we have a comma to skip over */

      while( isspace((int) str[ipos]) ) ipos++ ;            /* skip blanks */
      if( str[ipos] == ',' ) ipos++ ;                       /* skip commas */

   }  /* end of loop through selector string */

   if( g_opts.debug > 1 ) {
      fprintf(stderr,"+d int_list (vals = %d): ", subv[0]);
      for( ii = 1; ii <= subv[0]; ii++ ) fprintf(stderr,"%d ", subv[ii]);
      fputc('\n',stderr);
   }

   if( subv[0] == 0 ){ free(subv); subv = NULL; }
   return subv ;
}